

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::CompiledModule::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,CompiledModule *this,Orphanage orphanage)

{
  size_t sVar1;
  StringPtr value;
  Reader decl;
  _Base_ptr p_Var2;
  ElementCount index;
  bool bVar3;
  StringPtr importPath;
  BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  builder;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> importNames;
  Builder entry;
  Fault local_110;
  undefined1 local_108 [32];
  StructReader local_e8;
  _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
  local_b8;
  StructBuilder local_88;
  StructReader local_60;
  
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._24_8_ = this;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  capnp::_::OrphanBuilder::asStructReader
            ((StructReader *)(local_108 + 0x20),&(this->content).builder,(StructSize)0x10000);
  bVar3 = local_e8.pointerCount == 0;
  local_88.data = local_e8.pointers;
  if (bVar3) {
    local_88.data = (word *)0x0;
  }
  local_88.pointers._0_4_ = 0x7fffffff;
  if (!bVar3) {
    local_88.pointers._0_4_ = local_e8.nestingLimit;
  }
  local_88.segment._0_4_ = 0;
  local_88.segment._4_4_ = 0;
  local_88.capTable._0_4_ = 0;
  local_88.capTable._4_4_ = 0;
  if (!bVar3) {
    local_88.segment._0_4_ = local_e8.segment._0_4_;
    local_88.segment._4_4_ = local_e8.segment._4_4_;
    local_88.capTable._0_4_ = local_e8.capTable._0_4_;
    local_88.capTable._4_4_ = local_e8.capTable._4_4_;
  }
  capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_88,(word *)0x0);
  decl._reader.capTable = local_60.capTable;
  decl._reader.segment = local_60.segment;
  decl._reader.data = local_60.data;
  decl._reader.pointers = local_60.pointers;
  decl._reader.dataSize = local_60.dataSize;
  decl._reader.pointerCount = local_60.pointerCount;
  decl._reader._38_2_ = local_60._38_2_;
  decl._reader.nestingLimit = local_60.nestingLimit;
  decl._reader._44_4_ = local_60._44_4_;
  findImports(decl,(set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   &local_b8);
  capnp::_::OrphanBuilder::initStructList
            ((OrphanBuilder *)(local_108 + 0x20),orphanage.arena,orphanage.capTable,
             (ElementCount)local_b8._M_impl.super__Rb_tree_header._M_node_count,(StructSize)0x10001)
  ;
  (__return_storage_ptr__->builder).segment =
       (SegmentBuilder *)CONCAT44(local_e8.capTable._4_4_,local_e8.capTable._0_4_);
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_e8.data;
  (__return_storage_ptr__->builder).location = (word *)local_e8.pointers;
  (__return_storage_ptr__->builder).tag.content =
       CONCAT44(local_e8.segment._4_4_,local_e8.segment._0_4_);
  capnp::_::OrphanBuilder::asStructList
            ((ListBuilder *)(local_108 + 0x20),&__return_storage_ptr__->builder,(StructSize)0x10001)
  ;
  if ((_Rb_tree_header *)local_b8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_b8._M_impl.super__Rb_tree_header) {
    index = 0;
    p_Var2 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      sVar1 = *(size_t *)(p_Var2 + 1);
      value.content = *(ArrayPtr<const_char> *)(p_Var2 + 1);
      capnp::_::ListBuilder::getStructElement(&local_88,(ListBuilder *)(local_108 + 0x20),index);
      importPath.content.size_ = sVar1;
      importPath.content.ptr = (char *)local_108._24_8_;
      importRelative((CompiledModule *)local_108,importPath);
      if ((Impl *)local_108._0_8_ == (Impl *)0x0) {
        local_110.exception = (Exception *)0x0;
        local_108._0_8_ = (Impl *)0x0;
        local_108._8_8_ = (Module *)0x0;
        kj::_::Debug::Fault::init
                  (&local_110,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_110);
      }
      *(uint64_t *)local_88.data = (((Workspace *)(local_108._0_8_ + 0x68))->arena).nextChunkSize;
      local_108._16_8_ = CONCAT44(local_88.pointers._4_4_,(int)local_88.pointers);
      local_108._0_8_ = CONCAT44(local_88.segment._4_4_,local_88.segment._0_4_);
      local_108._8_8_ = CONCAT44(local_88.capTable._4_4_,local_88.capTable._0_4_);
      capnp::_::PointerBuilder::setBlob<capnp::Text>
                ((PointerBuilder *)local_108,(Reader)value.content);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      index = index + 1;
    } while ((_Rb_tree_header *)p_Var2 != &local_b8._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
  ::~_Rb_tree(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::CompiledModule::getFileImportTable(Orphanage orphanage) {
  // Build a table of imports for CodeGeneratorRequest.RequestedFile.imports. Note that we only
  // care about type imports, not constant value imports, since constant values (including default
  // values) are already embedded in full in the schema. In other words, we only need the imports
  // that would need to be #included in the generated code.

  std::set<kj::StringPtr> importNames;
  findImports(content.getReader().getRoot(), importNames);

  auto result = orphanage.newOrphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>(
      importNames.size());
  auto builder = result.get();

  uint i = 0;
  for (auto name: importNames) {
    // We presumably ran this import before, so it shouldn't throw now.
    auto entry = builder[i++];
    entry.setId(KJ_ASSERT_NONNULL(importRelative(name)).rootNode.getId());
    entry.setName(name);
  }

  return result;
}